

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

void __thiscall
spvtools::val::BasicBlock::DominatorIterator::DominatorIterator
          (DominatorIterator *this,BasicBlock *block,
          function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>
          *dominator_func)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  
  this->current_ = block;
  *(undefined8 *)&(this->dom_func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dom_func_).super__Function_base._M_functor + 8) = 0;
  (this->dom_func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dom_func_)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (dominator_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->dom_func_,(_Any_data *)dominator_func,__clone_functor);
    p_Var2 = dominator_func->_M_invoker;
    (this->dom_func_).super__Function_base._M_manager =
         (dominator_func->super__Function_base)._M_manager;
    (this->dom_func_)._M_invoker = p_Var2;
  }
  return;
}

Assistant:

BasicBlock::DominatorIterator::DominatorIterator(
    const BasicBlock* block,
    std::function<const BasicBlock*(const BasicBlock*)> dominator_func)
    : current_(block), dom_func_(dominator_func) {}